

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::AdvancedWriteFragmentCS::Setup(AdvancedWriteFragmentCS *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  this->m_program[0] = 0;
  this->m_program[1] = 0;
  this->m_storage_buffer = 0;
  this->m_counter_buffer = 0;
  this->m_draw_vertex_array = 0;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_fbo);
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_rt);
  return 0;
}

Assistant:

virtual long Setup()
	{
		memset(m_program, 0, sizeof(m_program));
		m_storage_buffer	= 0;
		m_counter_buffer	= 0;
		m_draw_vertex_array = 0;
		glGenFramebuffers(1, &m_fbo);
		glGenTextures(1, &m_rt);
		return NO_ERROR;
	}